

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  Ref<embree::Geometry> *pRVar24;
  Geometry *pGVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar49;
  int iVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar53;
  long lVar54;
  RTCRayN *pRVar55;
  ulong uVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  Scene *pSVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  float fVar77;
  float fVar109;
  float fVar110;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar98;
  float fVar111;
  undefined1 auVar99 [16];
  float fVar112;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar108;
  float fVar113;
  float fVar114;
  float fVar130;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar115;
  uint uVar131;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar133;
  float fVar140;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar136;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar138 [16];
  float fVar142;
  float fVar145;
  float fVar148;
  undefined1 auVar139 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar168;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar175;
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar184;
  float fVar185;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar208 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar221;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [16];
  float fVar230;
  undefined1 auVar227 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar240 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fStack_1440;
  float fStack_143c;
  undefined1 local_1438 [8];
  float fStack_1430;
  float fStack_142c;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  vbool<4> valid;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float fStack_13c4;
  undefined1 local_13a8 [16];
  Scene *scene;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  RTCFilterFunctionNArguments args;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [12];
  float fStack_12dc;
  float fStack_12d0;
  float fStack_12cc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  vfloat<4> tNear;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  long local_1160;
  long local_1158;
  ulong local_1150;
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined4 local_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 local_10e8;
  undefined4 uStack_10e4;
  undefined4 uStack_10e0;
  undefined4 uStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  uint local_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  uint local_10a8;
  uint uStack_10a4;
  uint uStack_10a0;
  uint uStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar53 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar113 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar204 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar217 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar203 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar216 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar222 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar241 = fVar203 * 0.99999964;
  fVar175 = fVar216 * 0.99999964;
  fVar235 = fVar222 * 0.99999964;
  fVar203 = fVar203 * 1.0000004;
  fVar216 = fVar216 * 1.0000004;
  fVar222 = fVar222 * 1.0000004;
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1150 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar63 = local_1150 ^ 0x10;
  iVar50 = (tray->tnear).field_0.i[k];
  auVar88._4_4_ = iVar50;
  auVar88._0_4_ = iVar50;
  auVar88._8_4_ = iVar50;
  auVar88._12_4_ = iVar50;
  iVar50 = (tray->tfar).field_0.i[k];
  auVar180._4_4_ = iVar50;
  auVar180._0_4_ = iVar50;
  auVar180._8_4_ = iVar50;
  auVar180._12_4_ = iVar50;
  local_1008 = mm_lookupmask_ps._0_8_;
  uStack_1000 = mm_lookupmask_ps._8_8_;
  local_1018 = mm_lookupmask_ps._240_8_;
  uStack_1010 = mm_lookupmask_ps._248_8_;
  local_1028 = fVar113;
  fStack_1024 = fVar113;
  fStack_1020 = fVar113;
  fStack_101c = fVar113;
  local_1038 = fVar204;
  fStack_1034 = fVar204;
  fStack_1030 = fVar204;
  fStack_102c = fVar204;
  local_1048 = fVar217;
  fStack_1044 = fVar217;
  fStack_1040 = fVar217;
  fStack_103c = fVar217;
  local_1058 = fVar203;
  fStack_1054 = fVar203;
  fStack_1050 = fVar203;
  fStack_104c = fVar203;
  local_1068 = fVar216;
  fStack_1064 = fVar216;
  fStack_1060 = fVar216;
  fStack_105c = fVar216;
  local_1078 = fVar222;
  fStack_1074 = fVar222;
  fStack_1070 = fVar222;
  fStack_106c = fVar222;
  local_1088 = fVar235;
  fStack_1084 = fVar235;
  fStack_1080 = fVar235;
  fStack_107c = fVar235;
  local_1098 = fVar241;
  fStack_1094 = fVar241;
  fStack_1090 = fVar241;
  fStack_108c = fVar241;
  local_1138 = fVar175;
  fStack_1134 = fVar175;
  fStack_1130 = fVar175;
  fStack_112c = fVar175;
  local_1148 = auVar88;
  fVar111 = fVar175;
  fVar112 = fVar175;
  fVar133 = fVar175;
  fVar132 = fVar235;
  fVar191 = fVar235;
  fVar189 = fVar235;
  fVar185 = fVar222;
  fVar130 = fVar222;
  fVar114 = fVar222;
  fVar110 = fVar216;
  fVar109 = fVar216;
  fVar77 = fVar216;
  fVar239 = fVar203;
  fVar237 = fVar203;
  fVar238 = fVar203;
  fVar230 = fVar241;
  fVar225 = fVar241;
  fVar211 = fVar241;
  fVar213 = fVar217;
  fVar221 = fVar217;
  fVar176 = fVar217;
  fVar207 = fVar204;
  fVar218 = fVar204;
  fVar215 = fVar204;
  fVar148 = fVar113;
  fVar145 = fVar113;
  fVar142 = fVar113;
LAB_00281b09:
  do {
    pSVar49 = pSVar53 + -1;
    pSVar53 = pSVar53 + -1;
    if ((float)pSVar49->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar49->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar75 = (pSVar53->ptr).ptr;
      while ((uVar75 & 8) == 0) {
        uVar56 = uVar75 & 0xfffffffffffffff0;
        fVar140 = *(float *)(ray + k * 4 + 0x70);
        pfVar21 = (float *)(uVar56 + 0x80 + uVar70);
        pfVar20 = (float *)(uVar56 + 0x20 + uVar70);
        auVar134._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar142) * fVar211;
        auVar134._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar145) * fVar225;
        auVar134._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar148) * fVar230;
        auVar134._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar113) * fVar241;
        auVar134 = maxps(auVar88,auVar134);
        pfVar21 = (float *)(uVar56 + 0x80 + local_1150);
        pfVar20 = (float *)(uVar56 + 0x20 + local_1150);
        auVar149._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar215) * fVar175;
        auVar149._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar218) * fVar111;
        auVar149._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar207) * fVar112;
        auVar149._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar204) * fVar133;
        pfVar21 = (float *)(uVar56 + 0x80 + uVar76);
        pfVar20 = (float *)(uVar56 + 0x20 + uVar76);
        auVar178._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar176) * fVar189;
        auVar178._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar221) * fVar191;
        auVar178._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar213) * fVar132;
        auVar178._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar217) * fVar235;
        auVar149 = maxps(auVar149,auVar178);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar134,auVar149);
        pfVar21 = (float *)(uVar56 + 0x80 + (uVar70 ^ 0x10));
        pfVar20 = (float *)(uVar56 + 0x20 + (uVar70 ^ 0x10));
        auVar158._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar142) * fVar238;
        auVar158._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar145) * fVar237;
        auVar158._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar148) * fVar239;
        auVar158._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar113) * fVar203;
        pfVar21 = (float *)(uVar56 + 0x80 + uVar63);
        pfVar20 = (float *)(uVar56 + 0x20 + uVar63);
        auVar169._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar215) * fVar77;
        auVar169._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar218) * fVar109;
        auVar169._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar207) * fVar110;
        auVar169._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar204) * fVar216;
        pfVar21 = (float *)(uVar56 + 0x80 + (uVar76 ^ 0x10));
        pfVar20 = (float *)(uVar56 + 0x20 + (uVar76 ^ 0x10));
        auVar171._0_4_ = ((*pfVar21 * fVar140 + *pfVar20) - fVar176) * fVar114;
        auVar171._4_4_ = ((pfVar21[1] * fVar140 + pfVar20[1]) - fVar221) * fVar130;
        auVar171._8_4_ = ((pfVar21[2] * fVar140 + pfVar20[2]) - fVar213) * fVar185;
        auVar171._12_4_ = ((pfVar21[3] * fVar140 + pfVar20[3]) - fVar217) * fVar222;
        auVar149 = minps(auVar169,auVar171);
        auVar134 = minps(auVar180,auVar158);
        auVar134 = minps(auVar134,auVar149);
        if (((uint)uVar75 & 7) == 6) {
          bVar32 = (fVar140 < *(float *)(uVar56 + 0xf0) && *(float *)(uVar56 + 0xe0) <= fVar140) &&
                   tNear.field_0._0_4_ <= auVar134._0_4_;
          bVar33 = (fVar140 < *(float *)(uVar56 + 0xf4) && *(float *)(uVar56 + 0xe4) <= fVar140) &&
                   tNear.field_0._4_4_ <= auVar134._4_4_;
          bVar34 = (fVar140 < *(float *)(uVar56 + 0xf8) && *(float *)(uVar56 + 0xe8) <= fVar140) &&
                   tNear.field_0._8_4_ <= auVar134._8_4_;
          bVar35 = (fVar140 < *(float *)(uVar56 + 0xfc) && *(float *)(uVar56 + 0xec) <= fVar140) &&
                   tNear.field_0._12_4_ <= auVar134._12_4_;
        }
        else {
          bVar32 = tNear.field_0._0_4_ <= auVar134._0_4_;
          bVar33 = tNear.field_0._4_4_ <= auVar134._4_4_;
          bVar34 = tNear.field_0._8_4_ <= auVar134._8_4_;
          bVar35 = tNear.field_0._12_4_ <= auVar134._12_4_;
        }
        auVar78._0_4_ = (uint)bVar32 * -0x80000000;
        auVar78._4_4_ = (uint)bVar33 * -0x80000000;
        auVar78._8_4_ = (uint)bVar34 * -0x80000000;
        auVar78._12_4_ = (uint)bVar35 * -0x80000000;
        uVar57 = movmskps((int)local_1150,auVar78);
        if (uVar57 == 0) {
          if (pSVar53 == stack) {
            return;
          }
          goto LAB_00281b09;
        }
        uVar57 = uVar57 & 0xff;
        lVar71 = 0;
        if (uVar57 != 0) {
          for (; (uVar57 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
          }
        }
        uVar75 = *(ulong *)(uVar56 + lVar71 * 8);
        uVar57 = uVar57 - 1 & uVar57;
        if (uVar57 != 0) {
          uVar115 = tNear.field_0.i[lVar71];
          lVar71 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
            }
          }
          uVar58 = *(ulong *)(uVar56 + lVar71 * 8);
          uVar131 = tNear.field_0.i[lVar71];
          uVar57 = uVar57 - 1 & uVar57;
          if (uVar57 == 0) {
            if (uVar115 < uVar131) {
              (pSVar53->ptr).ptr = uVar58;
              pSVar53->dist = uVar131;
              pSVar53 = pSVar53 + 1;
            }
            else {
              (pSVar53->ptr).ptr = uVar75;
              pSVar53->dist = uVar115;
              pSVar53 = pSVar53 + 1;
              uVar75 = uVar58;
            }
          }
          else {
            auVar135._8_4_ = uVar115;
            auVar135._0_8_ = uVar75;
            auVar135._12_4_ = 0;
            auVar159._8_4_ = uVar131;
            auVar159._0_8_ = uVar58;
            auVar159._12_4_ = 0;
            lVar71 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
              }
            }
            uVar23 = *(undefined8 *)(uVar56 + lVar71 * 8);
            iVar50 = tNear.field_0.i[lVar71];
            auVar150._8_4_ = iVar50;
            auVar150._0_8_ = uVar23;
            auVar150._12_4_ = 0;
            auVar79._8_4_ = -(uint)((int)uVar115 < (int)uVar131);
            uVar57 = uVar57 - 1 & uVar57;
            if (uVar57 == 0) {
              auVar79._4_4_ = auVar79._8_4_;
              auVar79._0_4_ = auVar79._8_4_;
              auVar79._12_4_ = auVar79._8_4_;
              auVar170._8_4_ = uVar131;
              auVar170._0_8_ = uVar58;
              auVar170._12_4_ = 0;
              auVar171 = blendvps(auVar170,auVar135,auVar79);
              auVar134 = blendvps(auVar135,auVar159,auVar79);
              auVar80._8_4_ = -(uint)(auVar171._8_4_ < iVar50);
              auVar80._4_4_ = auVar80._8_4_;
              auVar80._0_4_ = auVar80._8_4_;
              auVar80._12_4_ = auVar80._8_4_;
              auVar160._8_4_ = iVar50;
              auVar160._0_8_ = uVar23;
              auVar160._12_4_ = 0;
              auVar149 = blendvps(auVar160,auVar171,auVar80);
              auVar171 = blendvps(auVar171,auVar150,auVar80);
              auVar81._8_4_ = -(uint)(auVar134._8_4_ < auVar171._8_4_);
              auVar81._4_4_ = auVar81._8_4_;
              auVar81._0_4_ = auVar81._8_4_;
              auVar81._12_4_ = auVar81._8_4_;
              SVar151 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar171,auVar134,auVar81);
              SVar136 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar134,auVar171,auVar81);
              *pSVar53 = SVar136;
              pSVar53[1] = SVar151;
              uVar75 = auVar149._0_8_;
              pSVar53 = pSVar53 + 2;
            }
            else {
              lVar71 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                }
              }
              auVar82._4_4_ = auVar79._8_4_;
              auVar82._0_4_ = auVar79._8_4_;
              auVar82._8_4_ = auVar79._8_4_;
              auVar82._12_4_ = auVar79._8_4_;
              auVar171 = blendvps(auVar159,auVar135,auVar82);
              auVar88 = blendvps(auVar135,auVar159,auVar82);
              auVar177._8_4_ = tNear.field_0.i[lVar71];
              auVar177._0_8_ = *(undefined8 *)(uVar56 + lVar71 * 8);
              auVar177._12_4_ = 0;
              auVar83._8_4_ = -(uint)(iVar50 < tNear.field_0.i[lVar71]);
              auVar83._4_4_ = auVar83._8_4_;
              auVar83._0_4_ = auVar83._8_4_;
              auVar83._12_4_ = auVar83._8_4_;
              auVar149 = blendvps(auVar177,auVar150,auVar83);
              auVar134 = blendvps(auVar150,auVar177,auVar83);
              auVar84._8_4_ = -(uint)(auVar88._8_4_ < auVar134._8_4_);
              auVar84._4_4_ = auVar84._8_4_;
              auVar84._0_4_ = auVar84._8_4_;
              auVar84._12_4_ = auVar84._8_4_;
              auVar178 = blendvps(auVar134,auVar88,auVar84);
              SVar136 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar88,auVar134,auVar84);
              auVar85._8_4_ = -(uint)(auVar171._8_4_ < auVar149._8_4_);
              auVar85._4_4_ = auVar85._8_4_;
              auVar85._0_4_ = auVar85._8_4_;
              auVar85._12_4_ = auVar85._8_4_;
              auVar88 = blendvps(auVar149,auVar171,auVar85);
              auVar134 = blendvps(auVar171,auVar149,auVar85);
              auVar86._8_4_ = -(uint)(auVar134._8_4_ < auVar178._8_4_);
              auVar86._4_4_ = auVar86._8_4_;
              auVar86._0_4_ = auVar86._8_4_;
              auVar86._12_4_ = auVar86._8_4_;
              SVar151 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar178,auVar134,auVar86);
              SVar172 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar134,auVar178,auVar86);
              *pSVar53 = SVar136;
              pSVar53[1] = SVar172;
              pSVar53[2] = SVar151;
              uVar75 = auVar88._0_8_;
              pSVar53 = pSVar53 + 3;
              auVar88 = local_1148;
              fVar175 = local_1138;
              fVar111 = fStack_1134;
              fVar112 = fStack_1130;
              fVar133 = fStack_112c;
            }
          }
        }
      }
      local_1160 = (ulong)((uint)uVar75 & 0xf) - 8;
      if (local_1160 != 0) {
        uVar75 = uVar75 & 0xfffffffffffffff0;
        local_1158 = 0;
        do {
          lVar71 = local_1158 * 0x60;
          pSVar65 = context->scene;
          pRVar24 = (pSVar65->geometries).items;
          pGVar25 = pRVar24[*(uint *)(uVar75 + 0x40 + lVar71)].ptr;
          fVar113 = (pGVar25->time_range).lower;
          fVar204 = ((*(float *)(ray + k * 4 + 0x70) - fVar113) /
                    ((pGVar25->time_range).upper - fVar113)) * pGVar25->fnumTimeSegments;
          auVar137 = roundss(ZEXT416((uint)fVar113),ZEXT416((uint)fVar204),9);
          fVar113 = pGVar25->fnumTimeSegments + -1.0;
          if (fVar113 <= auVar137._0_4_) {
            auVar137._0_4_ = fVar113;
          }
          fVar113 = 0.0;
          if (0.0 <= auVar137._0_4_) {
            fVar113 = auVar137._0_4_;
          }
          lVar72 = (long)(int)fVar113 * 0x38;
          lVar26 = *(long *)(*(long *)&pGVar25[2].numPrimitives + lVar72);
          uVar64 = (ulong)*(uint *)(uVar75 + 4 + lVar71);
          lVar69 = lVar26 + (ulong)*(uint *)(uVar75 + lVar71) * 4;
          uVar56 = (ulong)*(uint *)(uVar75 + 0x10 + lVar71);
          lVar1 = lVar26 + uVar56 * 4;
          uVar58 = (ulong)*(uint *)(uVar75 + 0x20 + lVar71);
          pfVar20 = (float *)(lVar26 + uVar58 * 4);
          fVar175 = *pfVar20;
          fVar111 = pfVar20[1];
          fVar112 = pfVar20[2];
          uVar59 = (ulong)*(uint *)(uVar75 + 0x30 + lVar71);
          uVar23 = *(undefined8 *)(lVar26 + uVar59 * 4 + 8);
          lVar27 = *(long *)&pRVar24[*(uint *)(uVar75 + 0x44 + lVar71)].ptr[2].numPrimitives;
          lVar28 = *(long *)(lVar27 + lVar72);
          lVar26 = lVar28 + uVar64 * 4;
          uVar60 = (ulong)*(uint *)(uVar75 + 0x14 + lVar71);
          lVar2 = lVar28 + uVar60 * 4;
          uVar57 = *(uint *)(uVar75 + 0x24 + lVar71);
          pfVar20 = (float *)(lVar28 + (ulong)uVar57 * 4);
          fVar133 = *pfVar20;
          fVar142 = pfVar20[1];
          fVar145 = pfVar20[2];
          uVar61 = (ulong)*(uint *)(uVar75 + 0x34 + lVar71);
          pfVar20 = (float *)(lVar28 + uVar61 * 4);
          lVar28 = *(long *)&pRVar24[*(uint *)(uVar75 + 0x48 + lVar71)].ptr[2].numPrimitives;
          lVar29 = *(long *)(lVar28 + lVar72);
          uVar62 = (ulong)*(uint *)(uVar75 + 8 + lVar71);
          pfVar21 = (float *)(lVar29 + uVar62 * 4);
          uVar67 = (ulong)*(uint *)(uVar75 + 0x18 + lVar71);
          uVar115 = *(uint *)(uVar75 + 0x28 + lVar71);
          pfVar3 = (float *)(lVar29 + (ulong)uVar115 * 4);
          fVar148 = pfVar3[1];
          uVar68 = (ulong)*(uint *)(uVar75 + 0x38 + lVar71);
          pfVar4 = (float *)(lVar29 + uVar68 * 4);
          fVar204 = fVar204 - fVar113;
          lVar30 = *(long *)&pRVar24[*(uint *)(uVar75 + 0x4c + lVar71)].ptr[2].numPrimitives;
          lVar72 = *(long *)(lVar30 + lVar72);
          uVar66 = (ulong)*(uint *)(uVar75 + 0xc + lVar71);
          pfVar5 = (float *)(lVar72 + uVar66 * 4);
          uVar73 = (ulong)*(uint *)(uVar75 + 0x1c + lVar71);
          uVar74 = (ulong)*(uint *)(uVar75 + 0x2c + lVar71);
          pfVar6 = (float *)(lVar72 + uVar74 * 4);
          fVar215 = pfVar6[1];
          uVar131 = *(uint *)(uVar75 + 0x3c + lVar71);
          pfVar7 = (float *)(lVar72 + (ulong)uVar131 * 4);
          lVar54 = (long)((int)fVar113 + 1) * 0x38;
          lVar31 = *(long *)(*(long *)&pGVar25[2].numPrimitives + lVar54);
          pfVar8 = (float *)(lVar31 + (ulong)*(uint *)(uVar75 + lVar71) * 4);
          fStack_1420 = (float)uVar23;
          lVar28 = *(long *)(lVar28 + lVar54);
          pfVar9 = (float *)(lVar28 + uVar62 * 4);
          lVar27 = *(long *)(lVar27 + lVar54);
          pfVar10 = (float *)(lVar27 + uVar64 * 4);
          lVar30 = *(long *)(lVar30 + lVar54);
          pfVar11 = (float *)(lVar30 + uVar66 * 4);
          pfVar12 = (float *)(lVar31 + uVar56 * 4);
          pfVar13 = (float *)(lVar28 + uVar67 * 4);
          pfVar14 = (float *)(lVar27 + uVar60 * 4);
          pfVar15 = (float *)(lVar30 + uVar73 * 4);
          pfVar16 = (float *)(lVar31 + uVar58 * 4);
          fVar218 = *pfVar16;
          fVar207 = pfVar16[1];
          fVar176 = pfVar16[2];
          pfVar16 = (float *)(lVar28 + (ulong)uVar115 * 4);
          fVar221 = *pfVar16;
          fVar213 = pfVar16[1];
          fVar211 = pfVar16[2];
          pfVar16 = (float *)(lVar27 + (ulong)uVar57 * 4);
          fVar225 = *pfVar16;
          fVar230 = pfVar16[1];
          fVar241 = pfVar16[2];
          pfVar16 = (float *)(lVar30 + uVar74 * 4);
          fVar238 = *pfVar16;
          fVar237 = pfVar16[1];
          fVar239 = pfVar16[2];
          pfVar16 = (float *)(lVar31 + uVar59 * 4);
          pfVar17 = (float *)(lVar28 + uVar68 * 4);
          pfVar18 = (float *)(lVar27 + uVar61 * 4);
          pfVar19 = (float *)(lVar30 + (ulong)uVar131 * 4);
          fVar236 = 1.0 - fVar204;
          fVar193 = *pfVar4 * fVar236 + *pfVar12 * fVar204;
          fVar195 = *pfVar7 * fVar236 + *pfVar14 * fVar204;
          fVar197 = (float)local_12e8._8_4_ * fVar236 + *pfVar13 * fVar204;
          fVar199 = fStack_12dc * fVar236 + *pfVar15 * fVar204;
          local_1378 = *(float *)(lVar1 + 4) * fVar236 + pfVar12[1] * fVar204;
          fStack_1374 = *(float *)(lVar2 + 4) * fVar236 + pfVar14[1] * fVar204;
          fStack_1370 = *(float *)(lVar29 + uVar67 * 4 + 4) * fVar236 + pfVar13[1] * fVar204;
          fStack_136c = *(float *)(lVar72 + uVar73 * 4 + 4) * fVar236 + pfVar15[1] * fVar204;
          local_12b8 = *(float *)(lVar1 + 8) * fVar236 + pfVar12[2] * fVar204;
          fStack_12b4 = *(float *)(lVar2 + 8) * fVar236 + pfVar14[2] * fVar204;
          fStack_1360 = fStack_1360 * fVar236 + pfVar13[2] * fVar204;
          fStack_135c = fStack_135c * fVar236 + pfVar15[2] * fVar204;
          _local_1368 = CONCAT44(fStack_12b4,local_12b8);
          fVar184 = *pfVar21 * fVar236 + *pfVar16 * fVar204;
          fVar188 = *pfVar20 * fVar236 + *pfVar18 * fVar204;
          fVar190 = fStack_12f0 * fVar236 + *pfVar17 * fVar204;
          fVar192 = fStack_12ec * fVar236 + *pfVar19 * fVar204;
          local_fb8 = *pfVar5 * fVar236 + pfVar16[1] * fVar204;
          fStack_fb4 = pfVar20[1] * fVar236 + pfVar18[1] * fVar204;
          fStack_fb0 = pfVar4[1] * fVar236 + pfVar17[1] * fVar204;
          fStack_fac = pfVar7[1] * fVar236 + pfVar19[1] * fVar204;
          fStack_141c = (float)((ulong)uVar23 >> 0x20);
          local_fc8 = fVar236 * fStack_1420 + fVar204 * pfVar16[2];
          fStack_fc4 = fVar236 * pfVar20[2] + fVar204 * pfVar18[2];
          fStack_fc0 = fVar236 * fStack_1420 + fVar204 * pfVar17[2];
          fStack_fbc = fVar236 * fStack_141c + fVar204 * pfVar19[2];
          fVar113 = *(float *)(ray + k * 4);
          fVar217 = *(float *)(ray + k * 4 + 0x10);
          fVar157 = (*pfVar3 * fVar236 + *pfVar8 * fVar204) - fVar113;
          fVar166 = (*pfVar6 * fVar236 + *pfVar10 * fVar204) - fVar113;
          fVar167 = (fStack_1430 * fVar236 + *pfVar9 * fVar204) - fVar113;
          fVar168 = (fStack_142c * fVar236 + *pfVar11 * fVar204) - fVar113;
          fVar194 = fVar193 - fVar113;
          fVar196 = fVar195 - fVar113;
          fVar198 = fVar197 - fVar113;
          fVar200 = fVar199 - fVar113;
          fVar185 = fVar184 - fVar113;
          fVar189 = fVar188 - fVar113;
          fVar191 = fVar190 - fVar113;
          fVar113 = fVar192 - fVar113;
          fVar203 = *(float *)(ray + k * 4 + 0x20);
          fVar223 = (*(float *)(lVar69 + 4) * fVar236 + pfVar8[1] * fVar204) - fVar217;
          fVar228 = (*(float *)(lVar26 + 4) * fVar236 + pfVar10[1] * fVar204) - fVar217;
          fVar231 = (pfVar21[1] * fVar236 + pfVar9[1] * fVar204) - fVar217;
          fVar233 = (pfVar5[1] * fVar236 + pfVar11[1] * fVar204) - fVar217;
          fVar132 = (*(float *)(lVar69 + 8) * fVar236 + pfVar8[2] * fVar204) - fVar203;
          fVar140 = (*(float *)(lVar26 + 8) * fVar236 + pfVar10[2] * fVar204) - fVar203;
          fVar143 = (pfVar21[2] * fVar236 + pfVar9[2] * fVar204) - fVar203;
          fVar146 = (pfVar5[2] * fVar236 + pfVar11[2] * fVar204) - fVar203;
          local_1388 = local_fb8 - fVar217;
          fStack_1384 = fStack_fb4 - fVar217;
          fStack_1380 = fStack_fb0 - fVar217;
          fStack_137c = fStack_fac - fVar217;
          local_13e8 = local_fc8 - fVar203;
          fStack_13e4 = fStack_fc4 - fVar203;
          fStack_13e0 = fStack_fc0 - fVar203;
          fStack_13dc = fStack_fbc - fVar203;
          fVar114 = fVar185 - fVar157;
          fVar130 = fVar189 - fVar166;
          fStack_1170 = fVar191 - fVar167;
          fStack_116c = fVar113 - fVar168;
          fVar205 = local_1388 - fVar223;
          fVar209 = fStack_1384 - fVar228;
          fStack_1190 = fStack_1380 - fVar231;
          fStack_118c = fStack_137c - fVar233;
          fVar201 = local_13e8 - fVar132;
          fVar202 = fStack_13e4 - fVar140;
          fStack_1180 = fStack_13e0 - fVar143;
          fStack_117c = fStack_13dc - fVar146;
          _local_1178 = CONCAT44(fVar130,fVar114);
          _local_1188 = CONCAT44(fVar202,fVar201);
          _local_1198 = CONCAT44(fVar209,fVar205);
          fVar216 = *(float *)(ray + k * 4 + 0x50);
          fStack_1424 = *(float *)(ray + k * 4 + 0x60);
          fStack_13c4 = *(float *)(ray + k * 4 + 0x40);
          local_fe8 = (fVar205 * (local_13e8 + fVar132) - (local_1388 + fVar223) * fVar201) *
                      fStack_13c4 +
                      ((fVar185 + fVar157) * fVar201 - (local_13e8 + fVar132) * fVar114) * fVar216 +
                      (fVar114 * (local_1388 + fVar223) - (fVar185 + fVar157) * fVar205) *
                      fStack_1424;
          fStack_fe4 = (fVar209 * (fStack_13e4 + fVar140) - (fStack_1384 + fVar228) * fVar202) *
                       fStack_13c4 +
                       ((fVar189 + fVar166) * fVar202 - (fStack_13e4 + fVar140) * fVar130) * fVar216
                       + (fVar130 * (fStack_1384 + fVar228) - (fVar189 + fVar166) * fVar209) *
                         fStack_1424;
          fStack_fe0 = (fStack_1190 * (fStack_13e0 + fVar143) -
                       (fStack_1380 + fVar231) * fStack_1180) * fStack_13c4 +
                       ((fVar191 + fVar167) * fStack_1180 - (fStack_13e0 + fVar143) * fStack_1170) *
                       fVar216 + (fStack_1170 * (fStack_1380 + fVar231) -
                                 (fVar191 + fVar167) * fStack_1190) * fStack_1424;
          fStack_fdc = (fStack_118c * (fStack_13dc + fVar146) -
                       (fStack_137c + fVar233) * fStack_117c) * fStack_13c4 +
                       ((fVar113 + fVar168) * fStack_117c - (fStack_13dc + fVar146) * fStack_116c) *
                       fVar216 + (fStack_116c * (fStack_137c + fVar233) -
                                 (fVar113 + fVar168) * fStack_118c) * fStack_1424;
          fVar77 = local_1378 - fVar217;
          fVar109 = fStack_1374 - fVar217;
          fVar110 = fStack_1370 - fVar217;
          fVar222 = fStack_136c - fVar217;
          local_12b8 = local_12b8 - fVar203;
          fStack_12b4 = fStack_12b4 - fVar203;
          fStack_12b0 = fStack_1360 - fVar203;
          fStack_12ac = fStack_135c - fVar203;
          local_f98 = fVar157 - fVar194;
          fStack_f94 = fVar166 - fVar196;
          fStack_f90 = fVar167 - fVar198;
          fStack_f8c = fVar168 - fVar200;
          fVar224 = fVar223 - fVar77;
          fVar229 = fVar228 - fVar109;
          fVar232 = fVar231 - fVar110;
          fVar234 = fVar233 - fVar222;
          local_f88 = fVar132 - local_12b8;
          fStack_f84 = fVar140 - fStack_12b4;
          fStack_f80 = fVar143 - fStack_12b0;
          fStack_f7c = fVar146 - fStack_12ac;
          local_fd8 = (fVar224 * (fVar132 + local_12b8) - (fVar223 + fVar77) * local_f88) *
                      fStack_13c4 +
                      ((fVar157 + fVar194) * local_f88 - (fVar132 + local_12b8) * local_f98) *
                      fVar216 + (local_f98 * (fVar223 + fVar77) - (fVar157 + fVar194) * fVar224) *
                                fStack_1424;
          fStack_fd4 = (fVar229 * (fVar140 + fStack_12b4) - (fVar228 + fVar109) * fStack_f84) *
                       fStack_13c4 +
                       ((fVar166 + fVar196) * fStack_f84 - (fVar140 + fStack_12b4) * fStack_f94) *
                       fVar216 + (fStack_f94 * (fVar228 + fVar109) - (fVar166 + fVar196) * fVar229)
                                 * fStack_1424;
          fStack_fd0 = (fVar232 * (fVar143 + fStack_12b0) - (fVar231 + fVar110) * fStack_f80) *
                       fStack_13c4 +
                       ((fVar167 + fVar198) * fStack_f80 - (fVar143 + fStack_12b0) * fStack_f90) *
                       fVar216 + (fStack_f90 * (fVar231 + fVar110) - (fVar167 + fVar198) * fVar232)
                                 * fStack_1424;
          fStack_fcc = (fVar234 * (fVar146 + fStack_12ac) - (fVar233 + fVar222) * fStack_f7c) *
                       fStack_13c4 +
                       ((fVar168 + fVar200) * fStack_f7c - (fVar146 + fStack_12ac) * fStack_f8c) *
                       fVar216 + (fStack_f8c * (fVar233 + fVar222) - (fVar168 + fVar200) * fVar234)
                                 * fStack_1424;
          fVar235 = fVar194 - fVar185;
          fVar141 = fVar196 - fVar189;
          fVar144 = fVar198 - fVar191;
          fVar147 = fVar200 - fVar113;
          fVar206 = fVar77 - local_1388;
          fVar210 = fVar109 - fStack_1384;
          fVar212 = fVar110 - fStack_1380;
          fVar214 = fVar222 - fStack_137c;
          fVar242 = local_12b8 - local_13e8;
          fVar243 = fStack_12b4 - fStack_13e4;
          fStack_11a0 = fStack_12b0 - fStack_13e0;
          fStack_119c = fStack_12ac - fStack_13dc;
          local_12a8 = fVar77 + local_1388;
          fStack_12a4 = fVar109 + fStack_1384;
          fStack_12a0 = fVar110 + fStack_1380;
          fStack_129c = fVar222 + fStack_137c;
          local_1298 = local_12b8 + local_13e8;
          fStack_1294 = fStack_12b4 + fStack_13e4;
          fStack_1290 = fStack_12b0 + fStack_13e0;
          fStack_128c = fStack_12ac + fStack_13dc;
          _local_11a8 = CONCAT44(fVar243,fVar242);
          auVar116._0_4_ =
               (fVar206 * local_1298 - local_12a8 * fVar242) * fStack_13c4 +
               ((fVar185 + fVar194) * fVar242 - fVar235 * local_1298) * fVar216 +
               (fVar235 * local_12a8 - (fVar185 + fVar194) * fVar206) * fStack_1424;
          auVar116._4_4_ =
               (fVar210 * fStack_1294 - fStack_12a4 * fVar243) * fStack_13c4 +
               ((fVar189 + fVar196) * fVar243 - fVar141 * fStack_1294) * fVar216 +
               (fVar141 * fStack_12a4 - (fVar189 + fVar196) * fVar210) * fStack_1424;
          auVar116._8_4_ =
               (fVar212 * fStack_1290 - fStack_12a0 * fStack_11a0) * fStack_13c4 +
               ((fVar191 + fVar198) * fStack_11a0 - fVar144 * fStack_1290) * fVar216 +
               (fVar144 * fStack_12a0 - (fVar191 + fVar198) * fVar212) * fStack_1424;
          auVar116._12_4_ =
               (fVar214 * fStack_128c - fStack_129c * fStack_119c) * fStack_13c4 +
               ((fVar113 + fVar200) * fStack_119c - fVar147 * fStack_128c) * fVar216 +
               (fVar147 * fStack_129c - (fVar113 + fVar200) * fVar214) * fStack_1424;
          fVar194 = local_fe8 + local_fd8 + auVar116._0_4_;
          fVar196 = fStack_fe4 + fStack_fd4 + auVar116._4_4_;
          fVar198 = fStack_fe0 + fStack_fd0 + auVar116._8_4_;
          fVar200 = fStack_fdc + fStack_fcc + auVar116._12_4_;
          auVar87._4_4_ = fStack_fe4;
          auVar87._0_4_ = local_fe8;
          auVar87._8_4_ = fStack_fe0;
          auVar87._12_4_ = fStack_fdc;
          auVar36._4_4_ = fStack_fd4;
          auVar36._0_4_ = local_fd8;
          auVar36._8_4_ = fStack_fd0;
          auVar36._12_4_ = fStack_fcc;
          auVar88 = minps(auVar87,auVar36);
          auVar88 = minps(auVar88,auVar116);
          auVar179._4_4_ = fStack_fe4;
          auVar179._0_4_ = local_fe8;
          auVar179._8_4_ = fStack_fe0;
          auVar179._12_4_ = fStack_fdc;
          auVar37._4_4_ = fStack_fd4;
          auVar37._0_4_ = local_fd8;
          auVar37._8_4_ = fStack_fd0;
          auVar37._12_4_ = fStack_fcc;
          auVar180 = maxps(auVar179,auVar37);
          auVar180 = maxps(auVar180,auVar116);
          fVar113 = ABS(fVar194) * 1.1920929e-07;
          fVar185 = ABS(fVar196) * 1.1920929e-07;
          fVar189 = ABS(fVar198) * 1.1920929e-07;
          fVar191 = ABS(fVar200) * 1.1920929e-07;
          auVar181._4_4_ = -(uint)(auVar180._4_4_ <= fVar185);
          auVar181._0_4_ = -(uint)(auVar180._0_4_ <= fVar113);
          auVar181._8_4_ = -(uint)(auVar180._8_4_ <= fVar189);
          auVar181._12_4_ = -(uint)(auVar180._12_4_ <= fVar191);
          auVar89._4_4_ = -(uint)(-fVar185 <= auVar88._4_4_);
          auVar89._0_4_ = -(uint)(-fVar113 <= auVar88._0_4_);
          auVar89._8_4_ = -(uint)(-fVar189 <= auVar88._8_4_);
          auVar89._12_4_ = -(uint)(-fVar191 <= auVar88._12_4_);
          auVar181 = auVar181 | auVar89;
          lVar71 = uVar75 + lVar71;
          uVar52 = 0;
          iVar50 = movmskps(uVar131,auVar181);
          scene = pSVar65;
          if (iVar50 == 0) {
LAB_002839a3:
            uVar57 = 0;
            auVar162._4_4_ = fVar217;
            auVar162._0_4_ = fVar217;
            auVar162._8_4_ = fVar217;
            auVar162._12_4_ = fVar217;
          }
          else {
            local_ff8 = fVar194;
            fStack_ff4 = fVar196;
            fStack_ff0 = fVar198;
            fStack_fec = fVar200;
            local_fa8 = fVar206;
            fStack_fa4 = fVar210;
            fStack_fa0 = fVar212;
            fStack_f9c = fVar214;
            auVar161._0_4_ = fVar205 * local_f88 - fVar224 * fVar201;
            auVar161._4_4_ = fVar209 * fStack_f84 - fVar229 * fVar202;
            auVar161._8_4_ = fStack_1190 * fStack_f80 - fVar232 * fStack_1180;
            auVar161._12_4_ = fStack_118c * fStack_f7c - fVar234 * fStack_117c;
            auVar226._0_4_ = fVar224 * fVar242 - fVar206 * local_f88;
            auVar226._4_4_ = fVar229 * fVar243 - fVar210 * fStack_f84;
            auVar226._8_4_ = fVar232 * fStack_11a0 - fVar212 * fStack_f80;
            auVar226._12_4_ = fVar234 * fStack_119c - fVar214 * fStack_f7c;
            auVar90._4_4_ = -(uint)(ABS(fVar229 * fVar202) < ABS(fVar210 * fStack_f84));
            auVar90._0_4_ = -(uint)(ABS(fVar224 * fVar201) < ABS(fVar206 * local_f88));
            auVar90._8_4_ = -(uint)(ABS(fVar232 * fStack_1180) < ABS(fVar212 * fStack_f80));
            auVar90._12_4_ = -(uint)(ABS(fVar234 * fStack_117c) < ABS(fVar214 * fStack_f7c));
            local_11e8 = blendvps(auVar226,auVar161,auVar90);
            auVar173._0_4_ = fVar235 * local_f88 - local_f98 * fVar242;
            auVar173._4_4_ = fVar141 * fStack_f84 - fStack_f94 * fVar243;
            auVar173._8_4_ = fVar144 * fStack_f80 - fStack_f90 * fStack_11a0;
            auVar173._12_4_ = fVar147 * fStack_f7c - fStack_f8c * fStack_119c;
            auVar91._4_4_ = -(uint)(ABS(fVar130 * fStack_f84) < ABS(fStack_f94 * fVar243));
            auVar91._0_4_ = -(uint)(ABS(fVar114 * local_f88) < ABS(local_f98 * fVar242));
            auVar91._8_4_ = -(uint)(ABS(fStack_1170 * fStack_f80) < ABS(fStack_f90 * fStack_11a0));
            auVar91._12_4_ = -(uint)(ABS(fStack_116c * fStack_f7c) < ABS(fStack_f8c * fStack_119c));
            auVar44._4_4_ = fVar202 * fStack_f94 - fVar130 * fStack_f84;
            auVar44._0_4_ = fVar201 * local_f98 - fVar114 * local_f88;
            auVar44._8_4_ = fStack_1180 * fStack_f90 - fStack_1170 * fStack_f80;
            auVar44._12_4_ = fStack_117c * fStack_f8c - fStack_116c * fStack_f7c;
            local_11d8 = blendvps(auVar173,auVar44,auVar91);
            auVar186._0_4_ = local_f98 * fVar206 - fVar235 * fVar224;
            auVar186._4_4_ = fStack_f94 * fVar210 - fVar141 * fVar229;
            auVar186._8_4_ = fStack_f90 * fVar212 - fVar144 * fVar232;
            auVar186._12_4_ = fStack_f8c * fVar214 - fVar147 * fVar234;
            auVar92._4_4_ = -(uint)(ABS(fStack_f94 * fVar209) < ABS(fVar141 * fVar229));
            auVar92._0_4_ = -(uint)(ABS(local_f98 * fVar205) < ABS(fVar235 * fVar224));
            auVar92._8_4_ = -(uint)(ABS(fStack_f90 * fStack_1190) < ABS(fVar144 * fVar232));
            auVar92._12_4_ = -(uint)(ABS(fStack_f8c * fStack_118c) < ABS(fVar147 * fVar234));
            auVar38._4_4_ = fVar130 * fVar229 - fStack_f94 * fVar209;
            auVar38._0_4_ = fVar114 * fVar224 - local_f98 * fVar205;
            auVar38._8_4_ = fStack_1170 * fVar232 - fStack_f90 * fStack_1190;
            auVar38._12_4_ = fStack_116c * fVar234 - fStack_f8c * fStack_118c;
            local_11c8 = blendvps(auVar186,auVar38,auVar92);
            fVar113 = fStack_13c4 * local_11e8._0_4_ +
                      fVar216 * local_11d8._0_4_ + fStack_1424 * local_11c8._0_4_;
            fVar114 = fStack_13c4 * local_11e8._4_4_ +
                      fVar216 * local_11d8._4_4_ + fStack_1424 * local_11c8._4_4_;
            fVar130 = fStack_13c4 * local_11e8._8_4_ +
                      fVar216 * local_11d8._8_4_ + fStack_1424 * local_11c8._8_4_;
            fVar185 = fStack_13c4 * local_11e8._12_4_ +
                      fVar216 * local_11d8._12_4_ + fStack_1424 * local_11c8._12_4_;
            auVar93._0_4_ = fVar113 + fVar113;
            auVar93._4_4_ = fVar114 + fVar114;
            auVar93._8_4_ = fVar130 + fVar130;
            auVar93._12_4_ = fVar185 + fVar185;
            auVar117._0_4_ = fVar132 * local_11c8._0_4_;
            auVar117._4_4_ = fVar140 * local_11c8._4_4_;
            auVar117._8_4_ = fVar143 * local_11c8._8_4_;
            auVar117._12_4_ = fVar146 * local_11c8._12_4_;
            fVar189 = fVar157 * local_11e8._0_4_ + fVar223 * local_11d8._0_4_ + auVar117._0_4_;
            fVar191 = fVar166 * local_11e8._4_4_ + fVar228 * local_11d8._4_4_ + auVar117._4_4_;
            fVar132 = fVar167 * local_11e8._8_4_ + fVar231 * local_11d8._8_4_ + auVar117._8_4_;
            fVar235 = fVar168 * local_11e8._12_4_ + fVar233 * local_11d8._12_4_ + auVar117._12_4_;
            auVar88 = rcpps(auVar117,auVar93);
            fVar113 = auVar88._0_4_;
            fVar114 = auVar88._4_4_;
            fVar130 = auVar88._8_4_;
            fVar185 = auVar88._12_4_;
            fVar189 = ((1.0 - auVar93._0_4_ * fVar113) * fVar113 + fVar113) * (fVar189 + fVar189);
            fVar191 = ((1.0 - auVar93._4_4_ * fVar114) * fVar114 + fVar114) * (fVar191 + fVar191);
            fVar130 = ((1.0 - auVar93._8_4_ * fVar130) * fVar130 + fVar130) * (fVar132 + fVar132);
            fVar185 = ((1.0 - auVar93._12_4_ * fVar185) * fVar185 + fVar185) * (fVar235 + fVar235);
            fVar113 = *(float *)(ray + k * 4 + 0x80);
            _local_1438 = ZEXT416((uint)fVar113);
            fVar114 = *(float *)(ray + k * 4 + 0x30);
            auVar118._0_4_ = -(uint)(fVar189 <= fVar113 && fVar114 <= fVar189) & auVar181._0_4_;
            auVar118._4_4_ = -(uint)(fVar191 <= fVar113 && fVar114 <= fVar191) & auVar181._4_4_;
            auVar118._8_4_ = -(uint)(fVar130 <= fVar113 && fVar114 <= fVar130) & auVar181._8_4_;
            auVar118._12_4_ = -(uint)(fVar185 <= fVar113 && fVar114 <= fVar185) & auVar181._12_4_;
            iVar50 = movmskps(iVar50,auVar118);
            if (iVar50 == 0) goto LAB_002839a3;
            uVar115 = auVar118._0_4_ & -(uint)(auVar93._0_4_ != 0.0);
            uVar131 = auVar118._4_4_ & -(uint)(auVar93._4_4_ != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar131,uVar115);
            valid.field_0.i[2] = auVar118._8_4_ & -(uint)(auVar93._8_4_ != 0.0);
            valid.field_0.i[3] = auVar118._12_4_ & -(uint)(auVar93._12_4_ != 0.0);
            uVar57 = movmskps(iVar50,(undefined1  [16])valid.field_0);
            auVar162._4_4_ = fVar217;
            auVar162._0_4_ = fVar217;
            auVar162._8_4_ = fVar217;
            auVar162._12_4_ = fVar217;
            if (uVar57 != 0) {
              tNear.field_0.v[1] = fStack_fe4;
              tNear.field_0.v[0] = local_fe8;
              tNear.field_0.v[2] = fStack_fe0;
              tNear.field_0.v[3] = fStack_fdc;
              auVar48._4_4_ = fVar196;
              auVar48._0_4_ = fVar194;
              auVar48._8_4_ = fVar198;
              auVar48._12_4_ = fVar200;
              local_11f8._4_4_ = fVar191;
              local_11f8._0_4_ = fVar189;
              fStack_11f0 = fVar130;
              fStack_11ec = fVar185;
              local_11b8._8_8_ = uStack_1000;
              local_11b8._0_8_ = local_1008;
              auVar88 = rcpps(auVar162,auVar48);
              fVar217 = auVar88._0_4_;
              fVar203 = auVar88._4_4_;
              fVar216 = auVar88._8_4_;
              fVar222 = auVar88._12_4_;
              fVar77 = (float)DAT_01f7ba10;
              fVar109 = DAT_01f7ba10._4_4_;
              fVar110 = DAT_01f7ba10._12_4_;
              fVar113 = DAT_01f7ba10._8_4_;
              fVar217 = (float)(-(uint)(1e-18 <= ABS(fVar194)) &
                               (uint)((fVar77 - fVar194 * fVar217) * fVar217 + fVar217));
              fVar203 = (float)(-(uint)(1e-18 <= ABS(fVar196)) &
                               (uint)((fVar109 - fVar196 * fVar203) * fVar203 + fVar203));
              fVar216 = (float)(-(uint)(1e-18 <= ABS(fVar198)) &
                               (uint)((fVar113 - fVar198 * fVar216) * fVar216 + fVar216));
              fVar222 = (float)(-(uint)(1e-18 <= ABS(fVar200)) &
                               (uint)((fVar110 - fVar200 * fVar222) * fVar222 + fVar222));
              auVar182._0_4_ = local_fe8 * fVar217;
              auVar182._4_4_ = fStack_fe4 * fVar203;
              auVar182._8_4_ = fStack_fe0 * fVar216;
              auVar182._12_4_ = fStack_fdc * fVar222;
              auVar88 = minps(auVar182,_DAT_01f7ba10);
              auVar219._0_4_ = fVar217 * local_fd8;
              auVar219._4_4_ = fVar203 * fStack_fd4;
              auVar219._8_4_ = fVar216 * fStack_fd0;
              auVar219._12_4_ = fVar222 * fStack_fcc;
              auVar180 = minps(auVar219,_DAT_01f7ba10);
              auVar138._0_4_ = fVar77 - auVar88._0_4_;
              auVar138._4_4_ = fVar109 - auVar88._4_4_;
              auVar138._8_4_ = fVar113 - auVar88._8_4_;
              auVar138._12_4_ = fVar110 - auVar88._12_4_;
              auVar152._0_4_ = fVar77 - auVar180._0_4_;
              auVar152._4_4_ = fVar109 - auVar180._4_4_;
              auVar152._8_4_ = fVar113 - auVar180._8_4_;
              auVar152._12_4_ = fVar110 - auVar180._12_4_;
              local_1218 = blendvps(auVar88,auVar138,local_11b8);
              local_1208 = blendvps(auVar180,auVar152,local_11b8);
              auVar94._8_4_ = valid.field_0.i[2];
              auVar94._0_8_ = valid.field_0._0_8_;
              auVar94._12_4_ = valid.field_0.i[3];
              auVar180 = blendvps(_DAT_01f7a9f0,_local_11f8,auVar94);
              auVar153._4_4_ = auVar180._0_4_;
              auVar153._0_4_ = auVar180._4_4_;
              auVar153._8_4_ = auVar180._12_4_;
              auVar153._12_4_ = auVar180._8_4_;
              auVar88 = minps(auVar153,auVar180);
              auVar95._0_8_ = auVar88._8_8_;
              auVar95._8_4_ = auVar88._0_4_;
              auVar95._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar95,auVar88);
              auVar96._0_8_ =
                   CONCAT44(-(uint)(auVar88._4_4_ == auVar180._4_4_) & uVar131,
                            -(uint)(auVar88._0_4_ == auVar180._0_4_) & uVar115);
              auVar96._8_4_ = -(uint)(auVar88._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
              auVar96._12_4_ = -(uint)(auVar88._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
              iVar50 = movmskps(uVar57,auVar96);
              aVar119 = valid.field_0;
              if (iVar50 != 0) {
                aVar119.i[2] = auVar96._8_4_;
                aVar119._0_8_ = auVar96._0_8_;
                aVar119.i[3] = auVar96._12_4_;
              }
              uVar57 = movmskps(iVar50,(undefined1  [16])aVar119);
              lVar69 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                }
              }
LAB_00282a17:
              uVar57 = *(uint *)(lVar71 + 0x40 + lVar69 * 4);
              pRVar55 = (RTCRayN *)(ulong)uVar57;
              pGVar25 = (pSVar65->geometries).items[(long)pRVar55].ptr;
              if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar69] = 0.0;
LAB_00282d61:
                uVar52 = (undefined4)((ulong)pRVar55 >> 0x20);
                uVar57 = movmskps((int)pRVar55,(undefined1  [16])valid.field_0);
                if (uVar57 == 0) goto LAB_00282eba;
                auVar40._4_4_ = fVar191;
                auVar40._0_4_ = fVar189;
                auVar40._8_4_ = fVar130;
                auVar40._12_4_ = fVar185;
                auVar180 = blendvps(_DAT_01f7a9f0,auVar40,(undefined1  [16])valid.field_0);
                auVar154._4_4_ = auVar180._0_4_;
                auVar154._0_4_ = auVar180._4_4_;
                auVar154._8_4_ = auVar180._12_4_;
                auVar154._12_4_ = auVar180._8_4_;
                auVar88 = minps(auVar154,auVar180);
                auVar121._0_8_ = auVar88._8_8_;
                auVar121._8_4_ = auVar88._0_4_;
                auVar121._12_4_ = auVar88._4_4_;
                auVar88 = minps(auVar121,auVar88);
                auVar122._0_8_ =
                     CONCAT44(-(uint)(auVar88._4_4_ == auVar180._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar88._0_4_ == auVar180._0_4_) & valid.field_0._0_4_);
                auVar122._8_4_ = -(uint)(auVar88._8_4_ == auVar180._8_4_) & valid.field_0._8_4_;
                auVar122._12_4_ = -(uint)(auVar88._12_4_ == auVar180._12_4_) & valid.field_0._12_4_;
                iVar50 = movmskps(uVar57,auVar122);
                aVar98 = valid.field_0;
                if (iVar50 != 0) {
                  aVar98.i[2] = auVar122._8_4_;
                  aVar98._0_8_ = auVar122._0_8_;
                  aVar98.i[3] = auVar122._12_4_;
                }
                uVar51 = movmskps(iVar50,(undefined1  [16])aVar98);
                lVar69 = 0;
                if (CONCAT44(uVar52,uVar51) != 0) {
                  for (; (CONCAT44(uVar52,uVar51) >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                  }
                }
                goto LAB_00282a17;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar25->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_10f8 = *(undefined4 *)(local_1218 + lVar69 * 4);
                local_10e8 = *(undefined4 *)(local_1208 + lVar69 * 4);
                local_1128._4_4_ = *(undefined4 *)(local_11e8 + lVar69 * 4);
                local_1118._4_4_ = *(undefined4 *)(local_11d8 + lVar69 * 4);
                local_10c8._4_4_ = uVar57;
                local_10c8._0_4_ = uVar57;
                local_10c8._8_4_ = uVar57;
                local_10c8._12_4_ = uVar57;
                uVar52 = *(undefined4 *)(lVar71 + 0x50 + lVar69 * 4);
                local_10d8._4_4_ = uVar52;
                local_10d8._0_4_ = uVar52;
                local_10d8._8_4_ = uVar52;
                local_10d8._12_4_ = uVar52;
                uVar52 = *(undefined4 *)(local_11c8 + lVar69 * 4);
                local_1108._4_4_ = uVar52;
                local_1108._0_4_ = uVar52;
                local_1108._8_4_ = uVar52;
                local_1108._12_4_ = uVar52;
                local_1128._0_4_ = local_1128._4_4_;
                local_1128._8_4_ = local_1128._4_4_;
                local_1128._12_4_ = local_1128._4_4_;
                local_1118._0_4_ = local_1118._4_4_;
                local_1118._8_4_ = local_1118._4_4_;
                local_1118._12_4_ = local_1118._4_4_;
                uStack_10f4 = local_10f8;
                uStack_10f0 = local_10f8;
                uStack_10ec = local_10f8;
                uStack_10e4 = local_10e8;
                uStack_10e0 = local_10e8;
                uStack_10dc = local_10e8;
                local_10b8 = context->user->instID[0];
                uStack_10b4 = local_10b8;
                uStack_10b0 = local_10b8;
                uStack_10ac = local_10b8;
                local_10a8 = context->user->instPrimID[0];
                uStack_10a4 = local_10a8;
                uStack_10a0 = local_10a8;
                uStack_109c = local_10a8;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar69 * 4);
                local_13a8 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                args.valid = (int *)local_13a8;
                args.geometryUserPtr = pGVar25->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1128;
                args.N = 4;
                pRVar55 = (RTCRayN *)pGVar25->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar55 != (RTCRayN *)0x0) {
                  pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                  pSVar65 = scene;
                }
                if (local_13a8 == (undefined1  [16])0x0) {
                  auVar120._8_4_ = 0xffffffff;
                  auVar120._0_8_ = 0xffffffffffffffff;
                  auVar120._12_4_ = 0xffffffff;
                  auVar120 = auVar120 ^ _DAT_01f7ae20;
                }
                else {
                  pRVar55 = (RTCRayN *)context->args->filter;
                  if ((pRVar55 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar25->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                    pSVar65 = scene;
                  }
                  auVar97._0_4_ = -(uint)(local_13a8._0_4_ == 0);
                  auVar97._4_4_ = -(uint)(local_13a8._4_4_ == 0);
                  auVar97._8_4_ = -(uint)(local_13a8._8_4_ == 0);
                  auVar97._12_4_ = -(uint)(local_13a8._12_4_ == 0);
                  auVar120 = auVar97 ^ _DAT_01f7ae20;
                  if (local_13a8 != (undefined1  [16])0x0) {
                    auVar88 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar88;
                    auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar97);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar88;
                    pRVar55 = args.ray;
                  }
                }
                if ((_DAT_01f7bb20 & auVar120) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1438._0_4_;
                }
                else {
                  local_1438._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_1438._4_4_ = 0;
                  fStack_1430 = 0.0;
                  fStack_142c = 0.0;
                }
                valid.field_0.v[lVar69] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(fVar189 <= (float)local_1438._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fVar191 <= (float)local_1438._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fVar130 <= (float)local_1438._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fVar185 <= (float)local_1438._0_4_) & valid.field_0.i[3];
                goto LAB_00282d61;
              }
              uVar52 = *(undefined4 *)(local_1218 + lVar69 * 4);
              uVar51 = *(undefined4 *)(local_1208 + lVar69 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar69 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11e8 + lVar69 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11d8 + lVar69 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11c8 + lVar69 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar52;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar51;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar71 + 0x50 + lVar69 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar57;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar57 = context->user->instPrimID[0];
              uVar52 = 0;
              *(uint *)(ray + k * 4 + 0x140) = uVar57;
LAB_00282eba:
              fVar222 = *(float *)(ray + k * 4 + 0x10);
              fVar203 = *(float *)(ray + k * 4 + 0x20);
              fStack_13c4 = *(float *)(ray + k * 4 + 0x40);
              fVar216 = *(float *)(ray + k * 4 + 0x50);
              auVar162._4_4_ = fVar222;
              auVar162._0_4_ = fVar222;
              auVar162._8_4_ = fVar222;
              auVar162._12_4_ = fVar222;
              fStack_1424 = *(float *)(ray + k * 4 + 0x60);
              local_1388 = local_fb8 - fVar222;
              fStack_1384 = fStack_fb4 - fVar222;
              fStack_1380 = fStack_fb0 - fVar222;
              fStack_137c = fStack_fac - fVar222;
              local_13e8 = local_fc8 - fVar203;
              fStack_13e4 = fStack_fc4 - fVar203;
              fStack_13e0 = fStack_fc0 - fVar203;
              fStack_13dc = fStack_fbc - fVar203;
              fVar77 = local_1378 - fVar222;
              fVar109 = fStack_1374 - fVar222;
              fVar110 = fStack_1370 - fVar222;
              fVar222 = fStack_136c - fVar222;
              local_12b8 = local_1368 - fVar203;
              fStack_12b4 = fStack_1364 - fVar203;
              fStack_12b0 = fStack_1360 - fVar203;
              fStack_12ac = fStack_135c - fVar203;
              local_12a8 = local_1388 + fVar77;
              fStack_12a4 = fStack_1384 + fVar109;
              fStack_12a0 = fStack_1380 + fVar110;
              fStack_129c = fStack_137c + fVar222;
              local_1298 = local_13e8 + local_12b8;
              fStack_1294 = fStack_13e4 + fStack_12b4;
              fStack_1290 = fStack_13e0 + fStack_12b0;
              fStack_128c = fStack_13dc + fStack_12ac;
            }
          }
          fVar176 = (fVar112 * fVar236 + fVar176 * fVar204) - fVar203;
          fVar241 = (fVar145 * fVar236 + fVar241 * fVar204) - fVar203;
          fStack_12d0 = (fStack_12d0 * fVar236 + fVar211 * fVar204) - fVar203;
          fStack_12cc = (fStack_12cc * fVar236 + fVar239 * fVar204) - fVar203;
          fVar207 = (fVar111 * fVar236 + fVar207 * fVar204) - auVar162._0_4_;
          fVar211 = (fVar142 * fVar236 + fVar230 * fVar204) - auVar162._4_4_;
          fVar213 = (fVar148 * fVar236 + fVar213 * fVar204) - auVar162._8_4_;
          fVar215 = (fVar215 * fVar236 + fVar237 * fVar204) - auVar162._12_4_;
          fVar113 = *(float *)(ray + k * 4);
          fVar237 = (fVar175 * fVar236 + fVar218 * fVar204) - fVar113;
          fVar114 = (fVar133 * fVar236 + fVar225 * fVar204) - fVar113;
          fStack_1440 = (fStack_1440 * fVar236 + fVar221 * fVar204) - fVar113;
          fStack_143c = (fStack_143c * fVar236 + fVar238 * fVar204) - fVar113;
          fVar184 = fVar184 - fVar113;
          fVar188 = fVar188 - fVar113;
          fVar190 = fVar190 - fVar113;
          fVar192 = fVar192 - fVar113;
          fVar193 = fVar193 - fVar113;
          fVar195 = fVar195 - fVar113;
          fVar197 = fVar197 - fVar113;
          fVar199 = fVar199 - fVar113;
          fVar133 = fVar193 - fVar237;
          fVar142 = fVar195 - fVar114;
          fVar145 = fVar197 - fStack_1440;
          fVar148 = fVar199 - fStack_143c;
          local_1378 = fVar77 - fVar207;
          fStack_1374 = fVar109 - fVar211;
          fStack_1370 = fVar110 - fVar213;
          fStack_136c = fVar222 - fVar215;
          fVar225 = local_12b8 - fVar176;
          fVar230 = fStack_12b4 - fVar241;
          fStack_1360 = fStack_12b0 - fStack_12d0;
          fStack_135c = fStack_12ac - fStack_12cc;
          local_1438._0_4_ = local_1388 - fVar77;
          local_1438._4_4_ = fStack_1384 - fVar109;
          fStack_1430 = fStack_1380 - fVar110;
          fStack_142c = fStack_137c - fVar222;
          fVar113 = local_13e8 - local_12b8;
          fVar217 = fStack_13e4 - fStack_12b4;
          fVar175 = fStack_13e0 - fStack_12b0;
          fVar111 = fStack_13dc - fStack_12ac;
          _local_1368 = CONCAT44(fVar230,fVar225);
          fVar191 = fVar237 - fVar184;
          fVar235 = fVar114 - fVar188;
          fStack_12f0 = fStack_1440 - fVar190;
          fStack_12ec = fStack_143c - fVar192;
          fVar238 = fVar207 - local_1388;
          fVar130 = fVar211 - fStack_1384;
          fVar185 = fVar213 - fStack_1380;
          fVar189 = fVar215 - fStack_137c;
          local_12e8._0_4_ = fVar176 - local_13e8;
          local_12e8._4_4_ = fVar241 - fStack_13e4;
          local_12e8._8_4_ = fStack_12d0 - fStack_13e0;
          fStack_12dc = fStack_12cc - fStack_13dc;
          fVar218 = (local_1378 * (local_12b8 + fVar176) - (fVar77 + fVar207) * fVar225) *
                    fStack_13c4 +
                    ((fVar193 + fVar237) * fVar225 - (local_12b8 + fVar176) * fVar133) * fVar216 +
                    (fVar133 * (fVar77 + fVar207) - (fVar193 + fVar237) * local_1378) * fStack_1424;
          fVar221 = (fStack_1374 * (fStack_12b4 + fVar241) - (fVar109 + fVar211) * fVar230) *
                    fStack_13c4 +
                    ((fVar195 + fVar114) * fVar230 - (fStack_12b4 + fVar241) * fVar142) * fVar216 +
                    (fVar142 * (fVar109 + fVar211) - (fVar195 + fVar114) * fStack_1374) *
                    fStack_1424;
          tNear.field_0._0_8_ = CONCAT44(fVar221,fVar218);
          tNear.field_0.v[2] =
               (fStack_1370 * (fStack_12b0 + fStack_12d0) - (fVar110 + fVar213) * fStack_1360) *
               fStack_13c4 +
               ((fVar197 + fStack_1440) * fStack_1360 - (fStack_12b0 + fStack_12d0) * fVar145) *
               fVar216 + (fVar145 * (fVar110 + fVar213) - (fVar197 + fStack_1440) * fStack_1370) *
                         fStack_1424;
          tNear.field_0.v[3] =
               (fStack_136c * (fStack_12ac + fStack_12cc) - (fVar222 + fVar215) * fStack_135c) *
               fStack_13c4 +
               ((fVar199 + fStack_143c) * fStack_135c - (fStack_12ac + fStack_12cc) * fVar148) *
               fVar216 + (fVar148 * (fVar222 + fVar215) - (fVar199 + fStack_143c) * fStack_136c) *
                         fStack_1424;
          fVar239 = fVar184 - fVar193;
          fVar77 = fVar188 - fVar195;
          fVar109 = fVar190 - fVar197;
          fVar110 = fVar192 - fVar199;
          fVar132 = (fVar238 * (local_13e8 + fVar176) - (local_1388 + fVar207) * local_12e8._0_4_) *
                    fStack_13c4 +
                    ((fVar237 + fVar184) * local_12e8._0_4_ - (local_13e8 + fVar176) * fVar191) *
                    fVar216 + (fVar191 * (local_1388 + fVar207) - (fVar237 + fVar184) * fVar238) *
                              fStack_1424;
          fVar140 = (fVar130 * (fStack_13e4 + fVar241) - (fStack_1384 + fVar211) * local_12e8._4_4_)
                    * fStack_13c4 +
                    ((fVar114 + fVar188) * local_12e8._4_4_ - (fStack_13e4 + fVar241) * fVar235) *
                    fVar216 + (fVar235 * (fStack_1384 + fVar211) - (fVar114 + fVar188) * fVar130) *
                              fStack_1424;
          fVar141 = (fVar185 * (fStack_13e0 + fStack_12d0) -
                    (fStack_1380 + fVar213) * (float)local_12e8._8_4_) * fStack_13c4 +
                    ((fStack_1440 + fVar190) * (float)local_12e8._8_4_ -
                    (fStack_13e0 + fStack_12d0) * fStack_12f0) * fVar216 +
                    (fStack_12f0 * (fStack_1380 + fVar213) - (fStack_1440 + fVar190) * fVar185) *
                    fStack_1424;
          fVar143 = (fVar189 * (fStack_13dc + fStack_12cc) - (fStack_137c + fVar215) * fStack_12dc)
                    * fStack_13c4 +
                    ((fStack_143c + fVar192) * fStack_12dc -
                    (fStack_13dc + fStack_12cc) * fStack_12ec) * fVar216 +
                    (fStack_12ec * (fStack_137c + fVar215) - (fStack_143c + fVar192) * fVar189) *
                    fStack_1424;
          auVar99._0_4_ =
               ((float)local_1438._0_4_ * local_1298 - local_12a8 * fVar113) * fStack_13c4 +
               ((fVar193 + fVar184) * fVar113 - local_1298 * fVar239) * fVar216 +
               (fVar239 * local_12a8 - (fVar193 + fVar184) * (float)local_1438._0_4_) * fStack_1424;
          auVar99._4_4_ =
               ((float)local_1438._4_4_ * fStack_1294 - fStack_12a4 * fVar217) * fStack_13c4 +
               ((fVar195 + fVar188) * fVar217 - fStack_1294 * fVar77) * fVar216 +
               (fVar77 * fStack_12a4 - (fVar195 + fVar188) * (float)local_1438._4_4_) * fStack_1424;
          auVar99._8_4_ =
               (fStack_1430 * fStack_1290 - fStack_12a0 * fVar175) * fStack_13c4 +
               ((fVar197 + fVar190) * fVar175 - fStack_1290 * fVar109) * fVar216 +
               (fVar109 * fStack_12a0 - (fVar197 + fVar190) * fStack_1430) * fStack_1424;
          auVar99._12_4_ =
               (fStack_142c * fStack_128c - fStack_129c * fVar111) * fStack_13c4 +
               ((fVar199 + fVar192) * fVar111 - fStack_128c * fVar110) * fVar216 +
               (fVar110 * fStack_129c - (fVar199 + fVar192) * fStack_142c) * fStack_1424;
          local_1388 = fVar218 + fVar132 + auVar99._0_4_;
          fStack_1384 = fVar221 + fVar140 + auVar99._4_4_;
          fStack_1380 = tNear.field_0.v[2] + fVar141 + auVar99._8_4_;
          fStack_137c = tNear.field_0.v[3] + fVar143 + auVar99._12_4_;
          auVar123._8_4_ = tNear.field_0.i[2];
          auVar123._0_8_ = tNear.field_0._0_8_;
          auVar123._12_4_ = tNear.field_0.i[3];
          auVar45._4_4_ = fVar140;
          auVar45._0_4_ = fVar132;
          auVar45._8_4_ = fVar141;
          auVar45._12_4_ = fVar143;
          auVar88 = minps(auVar123,auVar45);
          auVar88 = minps(auVar88,auVar99);
          auVar163._8_4_ = tNear.field_0.i[2];
          auVar163._0_8_ = tNear.field_0._0_8_;
          auVar163._12_4_ = tNear.field_0.i[3];
          auVar46._4_4_ = fVar140;
          auVar46._0_4_ = fVar132;
          auVar46._8_4_ = fVar141;
          auVar46._12_4_ = fVar143;
          auVar180 = maxps(auVar163,auVar46);
          auVar180 = maxps(auVar180,auVar99);
          fVar204 = ABS(local_1388) * 1.1920929e-07;
          fVar203 = ABS(fStack_1384) * 1.1920929e-07;
          fVar222 = ABS(fStack_1380) * 1.1920929e-07;
          fVar112 = ABS(fStack_137c) * 1.1920929e-07;
          auVar164._4_4_ = -(uint)(auVar180._4_4_ <= fVar203);
          auVar164._0_4_ = -(uint)(auVar180._0_4_ <= fVar204);
          auVar164._8_4_ = -(uint)(auVar180._8_4_ <= fVar222);
          auVar164._12_4_ = -(uint)(auVar180._12_4_ <= fVar112);
          auVar124._4_4_ = -(uint)(-fVar203 <= auVar88._4_4_);
          auVar124._0_4_ = -(uint)(-fVar204 <= auVar88._0_4_);
          auVar124._8_4_ = -(uint)(-fVar222 <= auVar88._8_4_);
          auVar124._12_4_ = -(uint)(-fVar112 <= auVar88._12_4_);
          auVar164 = auVar164 | auVar124;
          iVar50 = movmskps(uVar57,auVar164);
          if (iVar50 != 0) {
            auVar187._0_4_ = fVar238 * fVar113 - (float)local_1438._0_4_ * local_12e8._0_4_;
            auVar187._4_4_ = fVar130 * fVar217 - (float)local_1438._4_4_ * local_12e8._4_4_;
            auVar187._8_4_ = fVar185 * fVar175 - fStack_1430 * (float)local_12e8._8_4_;
            auVar187._12_4_ = fVar189 * fVar111 - fStack_142c * fStack_12dc;
            auVar100._4_4_ =
                 -(uint)(ABS(fVar130 * fVar230) < ABS((float)local_1438._4_4_ * local_12e8._4_4_));
            auVar100._0_4_ =
                 -(uint)(ABS(fVar238 * fVar225) < ABS((float)local_1438._0_4_ * local_12e8._0_4_));
            auVar100._8_4_ =
                 -(uint)(ABS(fVar185 * fStack_1360) < ABS(fStack_1430 * (float)local_12e8._8_4_));
            auVar100._12_4_ = -(uint)(ABS(fVar189 * fStack_135c) < ABS(fStack_142c * fStack_12dc));
            auVar43._4_4_ = fStack_1374 * local_12e8._4_4_ - fVar130 * fVar230;
            auVar43._0_4_ = local_1378 * local_12e8._0_4_ - fVar238 * fVar225;
            auVar43._8_4_ = fStack_1370 * (float)local_12e8._8_4_ - fVar185 * fStack_1360;
            auVar43._12_4_ = fStack_136c * fStack_12dc - fVar189 * fStack_135c;
            local_11e8 = blendvps(auVar187,auVar43,auVar100);
            auVar183._0_4_ = fVar225 * fVar191 - fVar133 * local_12e8._0_4_;
            auVar183._4_4_ = fVar230 * fVar235 - fVar142 * local_12e8._4_4_;
            auVar183._8_4_ = fStack_1360 * fStack_12f0 - fVar145 * (float)local_12e8._8_4_;
            auVar183._12_4_ = fStack_135c * fStack_12ec - fVar148 * fStack_12dc;
            auVar240._0_4_ = fVar239 * local_12e8._0_4_ - fVar191 * fVar113;
            auVar240._4_4_ = fVar77 * local_12e8._4_4_ - fVar235 * fVar217;
            auVar240._8_4_ = fVar109 * (float)local_12e8._8_4_ - fStack_12f0 * fVar175;
            auVar240._12_4_ = fVar110 * fStack_12dc - fStack_12ec * fVar111;
            auVar101._4_4_ = -(uint)(ABS(fVar142 * local_12e8._4_4_) < ABS(fVar235 * fVar217));
            auVar101._0_4_ = -(uint)(ABS(fVar133 * local_12e8._0_4_) < ABS(fVar191 * fVar113));
            auVar101._8_4_ =
                 -(uint)(ABS(fVar145 * (float)local_12e8._8_4_) < ABS(fStack_12f0 * fVar175));
            auVar101._12_4_ = -(uint)(ABS(fVar148 * fStack_12dc) < ABS(fStack_12ec * fVar111));
            local_11d8 = blendvps(auVar240,auVar183,auVar101);
            auVar227._0_4_ = fVar133 * fVar238 - fVar191 * local_1378;
            auVar227._4_4_ = fVar142 * fVar130 - fVar235 * fStack_1374;
            auVar227._8_4_ = fVar145 * fVar185 - fStack_12f0 * fStack_1370;
            auVar227._12_4_ = fVar148 * fVar189 - fStack_12ec * fStack_136c;
            auVar174._0_4_ = fVar191 * (float)local_1438._0_4_ - fVar239 * fVar238;
            auVar174._4_4_ = fVar235 * (float)local_1438._4_4_ - fVar77 * fVar130;
            auVar174._8_4_ = fStack_12f0 * fStack_1430 - fVar109 * fVar185;
            auVar174._12_4_ = fStack_12ec * fStack_142c - fVar110 * fVar189;
            auVar102._4_4_ = -(uint)(ABS(fVar235 * fStack_1374) < ABS(fVar77 * fVar130));
            auVar102._0_4_ = -(uint)(ABS(fVar191 * local_1378) < ABS(fVar239 * fVar238));
            auVar102._8_4_ = -(uint)(ABS(fStack_12f0 * fStack_1370) < ABS(fVar109 * fVar185));
            auVar102._12_4_ = -(uint)(ABS(fStack_12ec * fStack_136c) < ABS(fVar110 * fVar189));
            local_11c8 = blendvps(auVar174,auVar227,auVar102);
            fVar112 = fStack_13c4 * local_11e8._0_4_ +
                      fVar216 * local_11d8._0_4_ + fStack_1424 * local_11c8._0_4_;
            fVar133 = fStack_13c4 * local_11e8._4_4_ +
                      fVar216 * local_11d8._4_4_ + fStack_1424 * local_11c8._4_4_;
            fVar142 = fStack_13c4 * local_11e8._8_4_ +
                      fVar216 * local_11d8._8_4_ + fStack_1424 * local_11c8._8_4_;
            fVar145 = fStack_13c4 * local_11e8._12_4_ +
                      fVar216 * local_11d8._12_4_ + fStack_1424 * local_11c8._12_4_;
            fVar112 = fVar112 + fVar112;
            fVar133 = fVar133 + fVar133;
            fVar142 = fVar142 + fVar142;
            fVar145 = fVar145 + fVar145;
            auVar103._0_4_ = fVar176 * local_11c8._0_4_;
            auVar103._4_4_ = fVar241 * local_11c8._4_4_;
            auVar103._8_4_ = fStack_12d0 * local_11c8._8_4_;
            auVar103._12_4_ = fStack_12cc * local_11c8._12_4_;
            fVar216 = fVar237 * local_11e8._0_4_ + fVar207 * local_11d8._0_4_ + auVar103._0_4_;
            fVar222 = fVar114 * local_11e8._4_4_ + fVar211 * local_11d8._4_4_ + auVar103._4_4_;
            fVar175 = fStack_1440 * local_11e8._8_4_ + fVar213 * local_11d8._8_4_ + auVar103._8_4_;
            fVar111 = fStack_143c * local_11e8._12_4_ +
                      fVar215 * local_11d8._12_4_ + auVar103._12_4_;
            auVar39._4_4_ = fVar133;
            auVar39._0_4_ = fVar112;
            auVar39._8_4_ = fVar142;
            auVar39._12_4_ = fVar145;
            auVar88 = rcpps(auVar103,auVar39);
            fVar113 = auVar88._0_4_;
            fVar204 = auVar88._4_4_;
            fVar217 = auVar88._8_4_;
            fVar203 = auVar88._12_4_;
            fVar216 = ((1.0 - fVar112 * fVar113) * fVar113 + fVar113) * (fVar216 + fVar216);
            fVar222 = ((1.0 - fVar133 * fVar204) * fVar204 + fVar204) * (fVar222 + fVar222);
            fVar217 = ((1.0 - fVar142 * fVar217) * fVar217 + fVar217) * (fVar175 + fVar175);
            fVar203 = ((1.0 - fVar145 * fVar203) * fVar203 + fVar203) * (fVar111 + fVar111);
            fVar204 = *(float *)(ray + k * 4 + 0x80);
            fVar113 = *(float *)(ray + k * 4 + 0x30);
            auVar125._0_4_ = -(uint)(fVar216 <= fVar204 && fVar113 <= fVar216) & auVar164._0_4_;
            auVar125._4_4_ = -(uint)(fVar222 <= fVar204 && fVar113 <= fVar222) & auVar164._4_4_;
            auVar125._8_4_ = -(uint)(fVar217 <= fVar204 && fVar113 <= fVar217) & auVar164._8_4_;
            auVar125._12_4_ = -(uint)(fVar203 <= fVar204 && fVar113 <= fVar203) & auVar164._12_4_;
            iVar50 = movmskps(iVar50,auVar125);
            if (iVar50 != 0) {
              uVar57 = auVar125._0_4_ & -(uint)(fVar112 != 0.0);
              uVar115 = auVar125._4_4_ & -(uint)(fVar133 != 0.0);
              valid.field_0._0_8_ = CONCAT44(uVar115,uVar57);
              valid.field_0.i[2] = auVar125._8_4_ & -(uint)(fVar142 != 0.0);
              valid.field_0.i[3] = auVar125._12_4_ & -(uint)(fVar145 != 0.0);
              iVar50 = movmskps(iVar50,(undefined1  [16])valid.field_0);
              if (iVar50 != 0) {
                auVar47._4_4_ = fStack_1384;
                auVar47._0_4_ = local_1388;
                auVar47._8_4_ = fStack_1380;
                auVar47._12_4_ = fStack_137c;
                local_11f8._4_4_ = fVar222;
                local_11f8._0_4_ = fVar216;
                fStack_11f0 = fVar217;
                fStack_11ec = fVar203;
                local_11b8._8_8_ = uStack_1010;
                local_11b8._0_8_ = local_1018;
                pSVar65 = context->scene;
                auVar88 = rcpps(auVar164,auVar47);
                fVar175 = auVar88._0_4_;
                fVar111 = auVar88._4_4_;
                fVar112 = auVar88._8_4_;
                fVar133 = auVar88._12_4_;
                fVar142 = (float)DAT_01f7ba10;
                fVar145 = DAT_01f7ba10._4_4_;
                fVar148 = DAT_01f7ba10._12_4_;
                fVar113 = DAT_01f7ba10._8_4_;
                fVar175 = (float)(-(uint)(1e-18 <= ABS(local_1388)) &
                                 (uint)((fVar142 - local_1388 * fVar175) * fVar175 + fVar175));
                fVar111 = (float)(-(uint)(1e-18 <= ABS(fStack_1384)) &
                                 (uint)((fVar145 - fStack_1384 * fVar111) * fVar111 + fVar111));
                fVar112 = (float)(-(uint)(1e-18 <= ABS(fStack_1380)) &
                                 (uint)((fVar113 - fStack_1380 * fVar112) * fVar112 + fVar112));
                fVar133 = (float)(-(uint)(1e-18 <= ABS(fStack_137c)) &
                                 (uint)((fVar148 - fStack_137c * fVar133) * fVar133 + fVar133));
                auVar220._0_4_ = fVar218 * fVar175;
                auVar220._4_4_ = fVar221 * fVar111;
                auVar220._8_4_ = tNear.field_0.v[2] * fVar112;
                auVar220._12_4_ = tNear.field_0.v[3] * fVar133;
                auVar180 = minps(auVar220,_DAT_01f7ba10);
                auVar208._0_4_ = fVar175 * fVar132;
                auVar208._4_4_ = fVar111 * fVar140;
                auVar208._8_4_ = fVar112 * fVar141;
                auVar208._12_4_ = fVar133 * fVar143;
                auVar88 = minps(auVar208,_DAT_01f7ba10);
                auVar139._0_4_ = fVar142 - auVar180._0_4_;
                auVar139._4_4_ = fVar145 - auVar180._4_4_;
                auVar139._8_4_ = fVar113 - auVar180._8_4_;
                auVar139._12_4_ = fVar148 - auVar180._12_4_;
                auVar165._0_4_ = fVar142 - auVar88._0_4_;
                auVar165._4_4_ = fVar145 - auVar88._4_4_;
                auVar165._8_4_ = fVar113 - auVar88._8_4_;
                auVar165._12_4_ = fVar148 - auVar88._12_4_;
                local_1218 = blendvps(auVar180,auVar139,local_11b8);
                local_1208 = blendvps(auVar88,auVar165,local_11b8);
                auVar104._8_4_ = valid.field_0.i[2];
                auVar104._0_8_ = valid.field_0._0_8_;
                auVar104._12_4_ = valid.field_0.i[3];
                auVar41._4_4_ = fVar222;
                auVar41._0_4_ = fVar216;
                auVar41._8_4_ = fVar217;
                auVar41._12_4_ = fVar203;
                auVar180 = blendvps(_DAT_01f7a9f0,auVar41,auVar104);
                auVar155._4_4_ = auVar180._0_4_;
                auVar155._0_4_ = auVar180._4_4_;
                auVar155._8_4_ = auVar180._12_4_;
                auVar155._12_4_ = auVar180._8_4_;
                auVar88 = minps(auVar155,auVar180);
                auVar105._0_8_ = auVar88._8_8_;
                auVar105._8_4_ = auVar88._0_4_;
                auVar105._12_4_ = auVar88._4_4_;
                auVar88 = minps(auVar105,auVar88);
                auVar106._0_8_ =
                     CONCAT44(-(uint)(auVar88._4_4_ == auVar180._4_4_) & uVar115,
                              -(uint)(auVar88._0_4_ == auVar180._0_4_) & uVar57);
                auVar106._8_4_ = -(uint)(auVar88._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                auVar106._12_4_ = -(uint)(auVar88._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
                iVar50 = movmskps(iVar50,auVar106);
                aVar126 = valid.field_0;
                if (iVar50 != 0) {
                  aVar126.i[2] = auVar106._8_4_;
                  aVar126._0_8_ = auVar106._0_8_;
                  aVar126.i[3] = auVar106._12_4_;
                }
                uVar51 = movmskps(iVar50,(undefined1  [16])aVar126);
                lVar69 = 0;
                if (CONCAT44(uVar52,uVar51) != 0) {
                  for (; (CONCAT44(uVar52,uVar51) >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                  }
                }
LAB_002834b8:
                uVar57 = *(uint *)(lVar71 + 0x40 + lVar69 * 4);
                pRVar55 = (RTCRayN *)(ulong)uVar57;
                pGVar25 = (pSVar65->geometries).items[(long)pRVar55].ptr;
                if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar69] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar52 = *(undefined4 *)(local_1218 + lVar69 * 4);
                    uVar51 = *(undefined4 *)(local_1208 + lVar69 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar69 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11e8 + lVar69 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11d8 + lVar69 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11c8 + lVar69 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar52;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar51;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar71 + 0x50 + lVar69 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar57;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_00283961;
                  }
                  local_10f8 = *(undefined4 *)(local_1218 + lVar69 * 4);
                  local_10e8 = *(undefined4 *)(local_1208 + lVar69 * 4);
                  uVar52 = *(undefined4 *)(local_11e8 + lVar69 * 4);
                  uVar51 = *(undefined4 *)(local_11d8 + lVar69 * 4);
                  local_10c8._4_4_ = uVar57;
                  local_10c8._0_4_ = uVar57;
                  local_10c8._8_4_ = uVar57;
                  local_10c8._12_4_ = uVar57;
                  uVar22 = *(undefined4 *)(lVar71 + 0x50 + lVar69 * 4);
                  local_10d8._4_4_ = uVar22;
                  local_10d8._0_4_ = uVar22;
                  local_10d8._8_4_ = uVar22;
                  local_10d8._12_4_ = uVar22;
                  local_1128._4_4_ = uVar52;
                  local_1128._0_4_ = uVar52;
                  local_1128._8_4_ = uVar52;
                  local_1128._12_4_ = uVar52;
                  local_1118._4_4_ = uVar51;
                  local_1118._0_4_ = uVar51;
                  local_1118._8_4_ = uVar51;
                  local_1118._12_4_ = uVar51;
                  local_1108._4_4_ = *(undefined4 *)(local_11c8 + lVar69 * 4);
                  local_1108._0_4_ = local_1108._4_4_;
                  local_1108._8_4_ = local_1108._4_4_;
                  local_1108._12_4_ = local_1108._4_4_;
                  uStack_10f4 = local_10f8;
                  uStack_10f0 = local_10f8;
                  uStack_10ec = local_10f8;
                  uStack_10e4 = local_10e8;
                  uStack_10e0 = local_10e8;
                  uStack_10dc = local_10e8;
                  local_10b8 = context->user->instID[0];
                  uStack_10b4 = local_10b8;
                  uStack_10b0 = local_10b8;
                  uStack_10ac = local_10b8;
                  local_10a8 = context->user->instPrimID[0];
                  uStack_10a4 = local_10a8;
                  uStack_10a0 = local_10a8;
                  uStack_109c = local_10a8;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar69 * 4);
                  local_13a8 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_13a8;
                  args.geometryUserPtr = pGVar25->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1128;
                  args.N = 4;
                  pRVar55 = (RTCRayN *)pGVar25->intersectionFilterN;
                  _local_1438 = ZEXT416((uint)fVar204);
                  args.ray = (RTCRayN *)ray;
                  if (pRVar55 != (RTCRayN *)0x0) {
                    pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                  }
                  if (local_13a8 == (undefined1  [16])0x0) {
                    auVar127._8_4_ = 0xffffffff;
                    auVar127._0_8_ = 0xffffffffffffffff;
                    auVar127._12_4_ = 0xffffffff;
                    auVar127 = auVar127 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar55 = (RTCRayN *)context->args->filter;
                    if ((pRVar55 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                    }
                    auVar107._0_4_ = -(uint)(local_13a8._0_4_ == 0);
                    auVar107._4_4_ = -(uint)(local_13a8._4_4_ == 0);
                    auVar107._8_4_ = -(uint)(local_13a8._8_4_ == 0);
                    auVar107._12_4_ = -(uint)(local_13a8._12_4_ == 0);
                    auVar127 = auVar107 ^ _DAT_01f7ae20;
                    if (local_13a8 != (undefined1  [16])0x0) {
                      auVar88 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar88;
                      auVar88 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar107);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar88;
                      pRVar55 = args.ray;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar127) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar204;
                  }
                  else {
                    fVar204 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar69] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar216 <= fVar204) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar222 <= fVar204) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar217 <= fVar204) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar203 <= fVar204) & valid.field_0.i[3];
                }
                iVar50 = movmskps((int)pRVar55,(undefined1  [16])valid.field_0);
                if (iVar50 == 0) goto LAB_00283961;
                auVar42._4_4_ = fVar222;
                auVar42._0_4_ = fVar216;
                auVar42._8_4_ = fVar217;
                auVar42._12_4_ = fVar203;
                auVar180 = blendvps(_DAT_01f7a9f0,auVar42,(undefined1  [16])valid.field_0);
                auVar156._4_4_ = auVar180._0_4_;
                auVar156._0_4_ = auVar180._4_4_;
                auVar156._8_4_ = auVar180._12_4_;
                auVar156._12_4_ = auVar180._8_4_;
                auVar88 = minps(auVar156,auVar180);
                auVar128._0_8_ = auVar88._8_8_;
                auVar128._8_4_ = auVar88._0_4_;
                auVar128._12_4_ = auVar88._4_4_;
                auVar88 = minps(auVar128,auVar88);
                auVar129._0_8_ =
                     CONCAT44(-(uint)(auVar88._4_4_ == auVar180._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar88._0_4_ == auVar180._0_4_) & valid.field_0._0_4_);
                auVar129._8_4_ = -(uint)(auVar88._8_4_ == auVar180._8_4_) & valid.field_0._8_4_;
                auVar129._12_4_ = -(uint)(auVar88._12_4_ == auVar180._12_4_) & valid.field_0._12_4_;
                iVar50 = movmskps(iVar50,auVar129);
                aVar108 = valid.field_0;
                if (iVar50 != 0) {
                  aVar108.i[2] = auVar129._8_4_;
                  aVar108._0_8_ = auVar129._0_8_;
                  aVar108.i[3] = auVar129._12_4_;
                }
                uVar52 = movmskps(iVar50,(undefined1  [16])aVar108);
                uVar56 = CONCAT44((int)((ulong)pRVar55 >> 0x20),uVar52);
                lVar69 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                  }
                }
                goto LAB_002834b8;
              }
            }
          }
LAB_00283961:
          local_1158 = local_1158 + 1;
        } while (local_1158 != local_1160);
      }
      uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar180._4_4_ = uVar52;
      auVar180._0_4_ = uVar52;
      auVar180._8_4_ = uVar52;
      auVar180._12_4_ = uVar52;
      auVar88 = local_1148;
      fVar142 = local_1028;
      fVar145 = fStack_1024;
      fVar148 = fStack_1020;
      fVar113 = fStack_101c;
      fVar215 = local_1038;
      fVar218 = fStack_1034;
      fVar207 = fStack_1030;
      fVar204 = fStack_102c;
      fVar176 = local_1048;
      fVar221 = fStack_1044;
      fVar213 = fStack_1040;
      fVar217 = fStack_103c;
      fVar211 = local_1098;
      fVar225 = fStack_1094;
      fVar230 = fStack_1090;
      fVar241 = fStack_108c;
      fVar175 = local_1138;
      fVar111 = fStack_1134;
      fVar112 = fStack_1130;
      fVar133 = fStack_112c;
      fVar238 = local_1058;
      fVar237 = fStack_1054;
      fVar239 = fStack_1050;
      fVar203 = fStack_104c;
      fVar77 = local_1068;
      fVar109 = fStack_1064;
      fVar110 = fStack_1060;
      fVar216 = fStack_105c;
      fVar114 = local_1078;
      fVar130 = fStack_1074;
      fVar185 = fStack_1070;
      fVar222 = fStack_106c;
      fVar189 = local_1088;
      fVar191 = fStack_1084;
      fVar132 = fStack_1080;
      fVar235 = fStack_107c;
    }
    if (pSVar53 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }